

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

bool ON_WildCardMatchNoCase(wchar_t *s,wchar_t *pattern)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  bool bVar3;
  wint_t wVar4;
  wint_t wVar5;
  
LAB_00680881:
  if ((pattern == (wchar_t *)0x0) || (*pattern == L'\0')) {
    if (s == (wchar_t *)0x0) {
LAB_0068092d:
      bVar3 = true;
    }
    else {
      bVar3 = *s == L'\0';
    }
  }
  else {
    if (*pattern != L'*') {
      do {
        wVar2 = *pattern;
        if (wVar2 == L'?') {
          if (*s == L'\0') goto LAB_0068091c;
        }
        else {
          if (wVar2 == L'\\') {
            if ((pattern[1] == L'?') || (pattern[1] == L'*')) {
              pattern = pattern + 1;
            }
          }
          else if (wVar2 == L'*') goto LAB_00680881;
          wVar4 = towupper(*pattern);
          wVar5 = towupper(*s);
          if (wVar4 != wVar5) goto LAB_0068091c;
          if (*s == L'\0') goto LAB_0068092d;
        }
        pattern = pattern + 1;
        s = s + 1;
      } while( true );
    }
    do {
      pwVar1 = pattern + 1;
      pattern = pattern + 1;
    } while (*pwVar1 == L'*');
    if (*pwVar1 == L'\0') goto LAB_0068092d;
    if (*s == L'\0') {
LAB_0068091c:
      bVar3 = false;
    }
    else {
      while (bVar3 = ON_WildCardMatchNoCase(s,pattern), !bVar3) {
        pwVar1 = s + 1;
        s = s + 1;
        if (*pwVar1 == L'\0') {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool ON_WildCardMatchNoCase(const wchar_t* s, const wchar_t* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' )
  {
    pattern++;
    while ( *pattern == '*' )
      pattern++;

    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatchNoCase(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' )
    {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }

    if ( *pattern == '\\' )
    {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( towupper(*pattern) != towupper(*s) )
    {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }

  return ON_WildCardMatchNoCase(s,pattern);
}